

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::ReleaseMarker
          (BacktrackingTokenStream<SGParser::GenericToken> *this,size_t markerIndex)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  size_t local_38;
  size_t markerIndex_local;
  
  local_38 = markerIndex;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*>,_std::_Select1st<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock_*>_>_>
               ::find(&(this->Markers)._M_t,&local_38);
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    p_Var2 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>,std::_Select1st<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>,std::_Select1st<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,SGParser::BacktrackingTokenStream<SGParser::GenericToken>::StreamBlock*>>>
                        *)&this->Markers,__position);
    if (__position._M_node == p_Var2) {
      ReleaseExtraBuffers(this);
    }
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool BacktrackingTokenStream<Token>::ReleaseMarker(size_t markerIndex) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;
    // Remove one marker of this value
    if (iMap == Markers.begin()) {
        Markers.erase(iMap);
        ReleaseExtraBuffers();
    } else
        Markers.erase(iMap);
    return true;
}